

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O1

void ReadArray<aiVector3t<float>>(IOStream *stream,aiVector3t<float> *out,uint size)

{
  long lVar1;
  float fVar2;
  float fVar3;
  undefined8 local_38;
  
  if (stream == (IOStream *)0x0) {
    __assert_fail("nullptr != stream",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Assbin/AssbinLoader.cpp"
                  ,0xc6,"void ReadArray(IOStream *, T *, unsigned int) [T = aiVector3t<float>]");
  }
  if (out != (aiVector3t<float> *)0x0) {
    if (size != 0) {
      lVar1 = 0;
      do {
        fVar2 = Read<float>(stream);
        fVar3 = Read<float>(stream);
        local_38 = CONCAT44(fVar3,fVar2);
        fVar2 = Read<float>(stream);
        *(undefined8 *)((long)&out->x + lVar1) = local_38;
        *(float *)((long)&out->z + lVar1) = fVar2;
        lVar1 = lVar1 + 0xc;
      } while ((ulong)size * 0xc != lVar1);
    }
    return;
  }
  __assert_fail("nullptr != out",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Assbin/AssbinLoader.cpp"
                ,199,"void ReadArray(IOStream *, T *, unsigned int) [T = aiVector3t<float>]");
}

Assistant:

void ReadArray( IOStream *stream, T * out, unsigned int size) {
    ai_assert( nullptr != stream );
    ai_assert( nullptr != out );

    for (unsigned int i=0; i<size; i++) {
        out[i] = Read<T>(stream);
    }
}